

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

string * __thiscall DataRefs::CSLPathCfgTy::operator=(CSLPathCfgTy *this,string *_p)

{
  string sStack_38;
  
  LTRemoveXPSystemPath(&sStack_38,_p);
  std::__cxx11::string::operator=((string *)&this->path,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  existsSave(this);
  return &this->path;
}

Assistant:

const std::string& DataRefs::CSLPathCfgTy::operator= (const std::string& _p)
{
    path = LTRemoveXPSystemPath(_p);        // store (shortened) path
    existsSave();                           // check for existence
    return path;
}